

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItem::installSceneEventFilter(QGraphicsItem *this,QGraphicsItem *filterItem)

{
  QGraphicsScene *pQVar1;
  
  pQVar1 = ((this->d_ptr).d)->scene;
  if (pQVar1 == (QGraphicsScene *)0x0) {
    installSceneEventFilter();
  }
  else {
    if (pQVar1 == ((filterItem->d_ptr).d)->scene) {
      QGraphicsScenePrivate::installSceneEventFilter
                (*(QGraphicsScenePrivate **)&pQVar1->field_0x8,this,filterItem);
      return;
    }
    installSceneEventFilter();
  }
  return;
}

Assistant:

void QGraphicsItem::installSceneEventFilter(QGraphicsItem *filterItem)
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in a scene.");
        return;
    }
    if (d_ptr->scene != filterItem->scene()) {
        qWarning("QGraphicsItem::installSceneEventFilter: event filters can only be installed"
                 " on items in the same scene.");
        return;
    }
    d_ptr->scene->d_func()->installSceneEventFilter(this, filterItem);
}